

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

bool __thiscall BackwardPass::IsEmptyLoopAfterMemOp(BackwardPass *this,Loop *loop)

{
  OpCode OVar1;
  Type pBVar2;
  BasicBlock *pBVar3;
  Instr *pIVar4;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  code *pcVar5;
  bool bVar6;
  BOOLEAN BVar7;
  undefined4 *puVar8;
  Type *ppBVar9;
  StackSym *pSVar10;
  Func **ppFVar11;
  Instr *this_01;
  long lVar12;
  uint uVar13;
  Instr *pIVar14;
  undefined1 local_58 [8];
  anon_class_16_2_3f78c113 IsInductionVariableUse;
  Iterator __iter;
  Loop *loop_local;
  
  __iter.current = (NodeBase *)loop;
  bVar6 = GlobOpt::HasMemOp(this->globOpt,loop);
  if (bVar6) {
    local_58 = (undefined1  [8])&__iter.current;
    IsInductionVariableUse.loop = (Loop **)this;
    if ((__iter.current[4].next == __iter.current + 4) ||
       ((__iter.current[4].next)->next->next != __iter.current + 4)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x239e,"(loop->blockList.HasTwo())","loop->blockList.HasTwo()");
      if (!bVar6) {
LAB_003f0124:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar8 = 0;
    }
    IsInductionVariableUse.this = (BackwardPass *)(__iter.current + 4);
    __iter.list = (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
                  IsInductionVariableUse.this;
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      if (__iter.list == (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar6) goto LAB_003f0124;
        *puVar8 = 0;
      }
      __iter.list = (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
                    ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      uVar13 = 0;
      if ((BackwardPass *)__iter.list == IsInductionVariableUse.this) break;
      ppBVar9 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)&IsInductionVariableUse.this);
      pBVar2 = *ppBVar9;
      uVar13 = 4;
      if ((pBVar2->field_0x18 & 1) == 0) {
        pBVar3 = pBVar2->next;
        ppFVar11 = (Func **)&pBVar3->firstInstr;
        if (pBVar3 == (BasicBlock *)0x0) {
          ppFVar11 = &pBVar2->func;
        }
        lVar12 = 0x18;
        if (pBVar3 == (BasicBlock *)0x0) {
          lVar12 = 0xd0;
        }
        if (*(long *)((long)&(*ppFVar11)->m_alloc + lVar12) == 0) {
          pIVar14 = (Instr *)0x0;
        }
        else {
          ppFVar11 = (Func **)&pBVar3->firstInstr;
          if (pBVar3 == (BasicBlock *)0x0) {
            ppFVar11 = &pBVar2->func;
          }
          lVar12 = 0x18;
          if (pBVar3 == (BasicBlock *)0x0) {
            lVar12 = 0xd0;
          }
          pIVar14 = *(Instr **)(*(long *)((long)&(*ppFVar11)->m_alloc + lVar12) + 0x10);
        }
        pIVar4 = pBVar2->firstInstr;
LAB_003eff52:
        do {
          this_01 = pIVar4;
          if (this_01 == pIVar14) {
            uVar13 = 0;
            goto LAB_003f00f7;
          }
          pIVar4 = this_01->m_next;
        } while ((((this_01->m_kind == InstrKindLabel) ||
                  (this_01->m_kind == InstrKindProfiledLabel)) ||
                 (bVar6 = IR::Instr::IsRealInstr(this_01), !bVar6)) ||
                ((this_01->m_opcode & ~ExtendedOpcodePrefix) == IncrLoopBodyCount));
        if (this_01->m_kind == InstrKindBranch) {
          OVar1 = this_01->m_opcode;
          if (OVar1 < ADD) {
            bVar6 = OVar1 == MultiBr || OVar1 == Br;
          }
          else {
            bVar6 = LowererMD::IsUnconditionalBranch(this_01);
          }
          if (bVar6 != false) goto LAB_003eff52;
        }
        OVar1 = this_01->m_opcode;
        if ((0x24 < OVar1 - 0x1c0) || ((0x1000000003U >> ((ulong)(OVar1 - 0x1c0) & 0x3f) & 1) == 0))
        {
          if (OVar1 - 0x26 < 2) {
            bVar6 = IsEmptyLoopAfterMemOp::anon_class_16_2_3f78c113::operator()
                              ((anon_class_16_2_3f78c113 *)local_58,this_01->m_src1);
            if (!bVar6) goto LAB_003f0103;
          }
          else if ((OVar1 != Nop) &&
                  ((uVar13 = 1, this_01->m_kind != InstrKindBranch ||
                   ((bVar6 = IsEmptyLoopAfterMemOp::anon_class_16_2_3f78c113::operator()
                                       ((anon_class_16_2_3f78c113 *)local_58,this_01->m_src1),
                    !bVar6 && (bVar6 = IsEmptyLoopAfterMemOp::anon_class_16_2_3f78c113::operator()
                                                 ((anon_class_16_2_3f78c113 *)local_58,
                                                  this_01->m_src2), !bVar6)))))) goto LAB_003f00f7;
          goto LAB_003eff52;
        }
        bVar6 = IsEmptyLoopAfterMemOp::anon_class_16_2_3f78c113::operator()
                          ((anon_class_16_2_3f78c113 *)local_58,this_01->m_dst);
        if (bVar6) goto LAB_003eff52;
        if (this_01->m_dst == (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x23b6,"(instr->GetDst())","instr->GetDst()");
          if (!bVar6) goto LAB_003f0124;
          *puVar8 = 0;
        }
        pSVar10 = IR::Opnd::GetStackSym(this_01->m_dst);
        if (pSVar10 == (StackSym *)0x0) goto LAB_003eff52;
        this_00 = (BVSparse<Memory::JitArenaAllocator> *)__iter.current[0x30].next[1].next;
        pSVar10 = IR::Opnd::GetStackSym(this_01->m_dst);
        BVar7 = BVSparse<Memory::JitArenaAllocator>::Test(this_00,(pSVar10->super_Sym).m_id);
        if (BVar7 == '\0') goto LAB_003eff52;
LAB_003f0103:
        uVar13 = 1;
      }
LAB_003f00f7:
    } while ((uVar13 & 3) == 0);
    bVar6 = uVar13 == 0;
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool
BackwardPass::IsEmptyLoopAfterMemOp(Loop *loop)
{
    if (globOpt->HasMemOp(loop))
    {
        const auto IsInductionVariableUse = [&](IR::Opnd *opnd) -> bool
        {
            Loop::InductionVariableChangeInfo  inductionVariableChangeInfo = { 0, 0 };
            return (opnd &&
                opnd->GetStackSym() &&
                loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(this->globOpt->GetVarSymID(opnd->GetStackSym())) &&
                (((Loop::InductionVariableChangeInfo)
                    loop->memOpInfo->inductionVariableChangeInfoMap->
                    LookupWithKey(this->globOpt->GetVarSymID(opnd->GetStackSym()), inductionVariableChangeInfo)).unroll != Js::Constants::InvalidLoopUnrollFactor));
        };

        Assert(loop->blockList.HasTwo());

        FOREACH_BLOCK_IN_LOOP(bblock, loop)
        {

            FOREACH_INSTR_IN_BLOCK_EDITING(instr, instrPrev, bblock)
            {
                if (instr->IsLabelInstr() || !instr->IsRealInstr() || instr->m_opcode == Js::OpCode::IncrLoopBodyCount || instr->m_opcode == Js::OpCode::StLoopBodyCount
                    || (instr->IsBranchInstr() && instr->AsBranchInstr()->IsUnconditional()))
                {
                    continue;
                }
                else
                {
                    switch (instr->m_opcode)
                    {
                    case Js::OpCode::Nop:
                        break;
                    case Js::OpCode::Ld_I4:
                    case Js::OpCode::Add_I4:
                    case Js::OpCode::Sub_I4:

                        if (!IsInductionVariableUse(instr->GetDst()))
                        {
                            Assert(instr->GetDst());
                            if (instr->GetDst()->GetStackSym()
                                && loop->memOpInfo->inductionVariablesUsedAfterLoop->Test(instr->GetDst()->GetStackSym()->m_id))
                            {
                                // We have use after the loop for a variable defined inside the loop. So the loop can't be removed.
                                return false;
                            }
                        }
                        break;
                    case Js::OpCode::Decr_A:
                    case Js::OpCode::Incr_A:
                        if (!IsInductionVariableUse(instr->GetSrc1()))
                        {
                            return false;
                        }
                        break;
                    default:
                        if (instr->IsBranchInstr())
                        {
                            if (IsInductionVariableUse(instr->GetSrc1()) || IsInductionVariableUse(instr->GetSrc2()))
                            {
                                break;
                            }
                        }
                        return false;
                    }
                }

            }
            NEXT_INSTR_IN_BLOCK_EDITING;

        }NEXT_BLOCK_IN_LIST;

        return true;
    }

    return false;
}